

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtCollisionObject * __thiscall
cbtCollisionWorldImporter::getCollisionObjectByName(cbtCollisionWorldImporter *this,char *name)

{
  cbtCollisionObject **ppcVar1;
  cbtCollisionObject *pcVar2;
  cbtHashString cStack_38;
  
  cbtHashString::cbtHashString(&cStack_38,name);
  ppcVar1 = cbtHashMap<cbtHashString,_cbtCollisionObject_*>::find(&this->m_nameColObjMap,&cStack_38)
  ;
  std::__cxx11::string::~string((string *)&cStack_38);
  if ((ppcVar1 == (cbtCollisionObject **)0x0) ||
     (pcVar2 = *ppcVar1, pcVar2 == (cbtCollisionObject *)0x0)) {
    pcVar2 = (cbtCollisionObject *)0x0;
  }
  return pcVar2;
}

Assistant:

cbtCollisionObject* cbtCollisionWorldImporter::getCollisionObjectByName(const char* name)
{
	cbtCollisionObject** bodyPtr = m_nameColObjMap.find(name);
	if (bodyPtr && *bodyPtr)
	{
		return *bodyPtr;
	}
	return 0;
}